

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::set_button(CImgDisplay *this,uint button,bool is_pressed)

{
  uint local_28;
  uint local_24;
  uint buttoncode;
  bool is_pressed_local;
  uint button_local;
  CImgDisplay *this_local;
  
  if (button == 1) {
    local_24 = 1;
  }
  else {
    if (button == 2) {
      local_28 = 2;
    }
    else {
      local_28 = 0;
      if (button == 3) {
        local_28 = 4;
      }
    }
    local_24 = local_28;
  }
  if (is_pressed) {
    this->_button = this->_button | local_24;
  }
  else {
    this->_button = this->_button & (local_24 ^ 0xffffffff);
  }
  this->_is_event = (bool)(-(local_24 != 0) & 1);
  return this;
}

Assistant:

CImgDisplay& set_button(const unsigned int button, const bool is_pressed=true) {
      const unsigned int buttoncode = button==1?1:button==2?2:button==3?4:0;
      if (is_pressed) _button |= buttoncode; else _button &= ~buttoncode;
      _is_event = buttoncode?true:false;
      return *this;
    }